

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O2

bool IsWellFormedPackage(Package *txns,PackageValidationState *state,bool require_sorted)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  pointer psVar8;
  int iVar9;
  long in_FS_OFFSET;
  allocator<char> local_c2;
  allocator<char> local_c1;
  string local_c0;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  later_txids;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar8 = (txns->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (txns->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (uint)((ulong)((long)psVar1 - (long)psVar8) >> 4);
  if (uVar5 < 0x1a) {
    iVar9 = 0;
    for (; psVar8 != psVar1; psVar8 = psVar8 + 1) {
      peVar2 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      later_txids._M_h.
      super__Hashtable_base<uint256,_uint256,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      .
      super__Hash_code_base<uint256,_uint256,_std::__detail::_Identity,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
      .super__Hashtable_ebo_helper<1,_SaltedTxidHasher,_false>._M_tp.k0 = (uint64_t)&TX_NO_WITNESS;
      later_txids._M_h.
      super__Hashtable_base<uint256,_uint256,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      .
      super__Hash_code_base<uint256,_uint256,_std::__detail::_Identity,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
      .super__Hashtable_ebo_helper<1,_SaltedTxidHasher,_false>._M_tp.k1 = (uint64_t)peVar2;
      sVar6 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                        ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&later_txids);
      local_58._M_dataplus._M_p = &TX_WITH_WITNESS.allow_witness;
      local_58._M_string_length = (size_type)peVar2;
      sVar7 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                        ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&local_58);
      iVar9 = iVar9 + (int)sVar7 + (int)sVar6 * 3;
    }
    if ((uVar5 < 2) || (iVar9 < 0x62a21)) {
      std::
      _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_Hashtable(&later_txids._M_h);
      psVar8 = (txns->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (txns->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_c0._M_string_length = 0;
      local_c0._M_dataplus._M_p = (pointer)&later_txids._M_h;
      for (; psVar8 != psVar1; psVar8 = psVar8 + 1) {
        peVar2 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        local_58._M_dataplus._M_p =
             *(pointer *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        local_58._M_string_length =
             *(size_type *)
              ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        local_58.field_2._M_allocated_capacity =
             *(undefined8 *)
              ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        local_58.field_2._8_8_ =
             *(undefined8 *)
              ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        std::
        insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
        ::operator=((insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
                     *)&local_c0,(value_type *)&local_58);
      }
      if (later_txids._M_h._M_element_count ==
          (long)(txns->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(txns->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4) {
        if (require_sorted) {
          bVar3 = IsTopoSortedPackage(txns,&later_txids);
          if (!bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_58,"package-not-sorted",&local_c1);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c2);
            bVar3 = ValidationState<PackageValidationResult>::Invalid
                              (&state->super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                               &local_58,&local_c0);
            goto LAB_00256b0d;
          }
        }
        bVar4 = IsConsistentPackage(txns);
        bVar3 = true;
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"conflict-in-package",&local_c1);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c2);
          bVar3 = ValidationState<PackageValidationResult>::Invalid
                            (&state->super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                             &local_58,&local_c0);
          goto LAB_00256b0d;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"package-contains-duplicates",&local_c1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c2);
        bVar3 = ValidationState<PackageValidationResult>::Invalid
                          (&state->super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                           &local_58,&local_c0);
LAB_00256b0d:
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_58);
      }
      std::
      _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&later_txids._M_h);
      goto LAB_00256b30;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&later_txids,"package-too-large",(allocator<char> *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_c1);
    bVar3 = ValidationState<PackageValidationResult>::Invalid
                      (&state->super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                       (string *)&later_txids,&local_58);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&later_txids,"package-too-many-transactions",(allocator<char> *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_c1);
    bVar3 = ValidationState<PackageValidationResult>::Invalid
                      (&state->super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                       (string *)&later_txids,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&later_txids);
LAB_00256b30:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool IsWellFormedPackage(const Package& txns, PackageValidationState& state, bool require_sorted)
{
    const unsigned int package_count = txns.size();

    if (package_count > MAX_PACKAGE_COUNT) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-too-many-transactions");
    }

    const int64_t total_weight = std::accumulate(txns.cbegin(), txns.cend(), 0,
                               [](int64_t sum, const auto& tx) { return sum + GetTransactionWeight(*tx); });
    // If the package only contains 1 tx, it's better to report the policy violation on individual tx weight.
    if (package_count > 1 && total_weight > MAX_PACKAGE_WEIGHT) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-too-large");
    }

    std::unordered_set<uint256, SaltedTxidHasher> later_txids;
    std::transform(txns.cbegin(), txns.cend(), std::inserter(later_txids, later_txids.end()),
                   [](const auto& tx) { return tx->GetHash(); });

    // Package must not contain any duplicate transactions, which is checked by txid. This also
    // includes transactions with duplicate wtxids and same-txid-different-witness transactions.
    if (later_txids.size() != txns.size()) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-contains-duplicates");
    }

    // Require the package to be sorted in order of dependency, i.e. parents appear before children.
    // An unsorted package will fail anyway on missing-inputs, but it's better to quit earlier and
    // fail on something less ambiguous (missing-inputs could also be an orphan or trying to
    // spend nonexistent coins).
    if (require_sorted && !IsTopoSortedPackage(txns, later_txids)) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "package-not-sorted");
    }

    // Don't allow any conflicting transactions, i.e. spending the same inputs, in a package.
    if (!IsConsistentPackage(txns)) {
        return state.Invalid(PackageValidationResult::PCKG_POLICY, "conflict-in-package");
    }
    return true;
}